

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O3

void Gia_ManPrintStatsShort(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  
  pGVar3 = p;
  Abc_Print((int)p,"i/o =%7d/%7d  ",(ulong)(uint)(p->vCis->nSize - p->nRegs),
            (ulong)(uint)(p->vCos->nSize - p->nRegs));
  iVar2 = (int)pGVar3;
  Abc_Print(iVar2,"ff =%7d  ",(ulong)(uint)p->nRegs);
  Abc_Print(iVar2,"and =%8d  ",(ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs));
  uVar1 = Gia_ManLevelNum(p);
  iVar2 = (int)p;
  Abc_Print(iVar2,"lev =%5d  ",(ulong)uVar1);
  Abc_Print(iVar2,"\n");
  return;
}

Assistant:

void Gia_ManPrintStatsShort( Gia_Man_t * p )
{
    Abc_Print( 1, "i/o =%7d/%7d  ", Gia_ManPiNum(p), Gia_ManPoNum(p) );
    Abc_Print( 1, "ff =%7d  ", Gia_ManRegNum(p) );
    Abc_Print( 1, "and =%8d  ", Gia_ManAndNum(p) );
    Abc_Print( 1, "lev =%5d  ", Gia_ManLevelNum(p) );
//    Abc_Print( 1, "mem =%5.2f MB", 12.0*Gia_ManObjNum(p)/(1<<20) );
    Abc_Print( 1, "\n" );
}